

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::Exception::Context>::disposeImpl
          (HeapDisposer<kj::Exception::Context> *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  
  if (pointer != (void *)0x0) {
    if (*(long *)((long)pointer + 0x30) != 0) {
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x28))();
    }
    lVar1 = *(long *)((long)pointer + 0x10);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x18);
      *(undefined8 *)((long)pointer + 0x10) = 0;
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x20))
                (*(undefined8 **)((long)pointer + 0x20),lVar1,1,uVar2,uVar2,0);
    }
    operator_delete(pointer,0x38);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }